

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArmaturePopulate.cpp
# Opt level: O0

aiNode * Assimp::ArmaturePopulate::GetNodeFromStack
                   (aiString *node_name,vector<aiNode_*,_std::allocator<aiNode_*>_> *nodes)

{
  iterator this;
  bool bVar1;
  reference ppaVar2;
  Logger *pLVar3;
  basic_formatter *this_00;
  const_iterator local_200;
  char *local_1e8;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  string local_68;
  aiNode *local_48;
  aiNode *element;
  aiNode **local_38;
  aiNode *local_30;
  aiNode *found;
  iterator iter;
  vector<aiNode_*,_std::allocator<aiNode_*>_> *nodes_local;
  aiString *node_name_local;
  
  iter._M_current = (aiNode **)nodes;
  __gnu_cxx::__normal_iterator<aiNode_**,_std::vector<aiNode_*,_std::allocator<aiNode_*>_>_>::
  __normal_iterator((__normal_iterator<aiNode_**,_std::vector<aiNode_*,_std::allocator<aiNode_*>_>_>
                     *)&found);
  local_30 = (aiNode *)0x0;
  local_38 = (aiNode **)std::vector<aiNode_*,_std::allocator<aiNode_*>_>::begin(iter._M_current);
  found = (aiNode *)local_38;
  do {
    element = (aiNode *)
              std::vector<aiNode_*,_std::allocator<aiNode_*>_>::end
                        ((vector<aiNode_*,_std::allocator<aiNode_*>_> *)iter._M_current);
    bVar1 = __gnu_cxx::operator<
                      ((__normal_iterator<aiNode_**,_std::vector<aiNode_*,_std::allocator<aiNode_*>_>_>
                        *)&found,
                       (__normal_iterator<aiNode_**,_std::vector<aiNode_*,_std::allocator<aiNode_*>_>_>
                        *)&element);
    if (!bVar1) {
LAB_005d86be:
      if (local_30 == (aiNode *)0x0) {
        pLVar3 = DefaultLogger::get();
        Logger::error(pLVar3,"[Serious] GetNodeFromStack() can\'t find node from stack!");
        node_name_local = (aiString *)0x0;
      }
      else {
        pLVar3 = DefaultLogger::get();
        Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
        basic_formatter<char[26]>(&local_1e0,(char (*) [26])"Removed node from stack: ");
        local_1e8 = aiString::C_Str(&local_30->mName);
        this_00 = (basic_formatter *)
                  Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                  operator_((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                            &local_1e0,&local_1e8);
        Formatter::basic_formatter::operator_cast_to_string(&local_68,this_00);
        Logger::info(pLVar3,&local_68);
        std::__cxx11::string::~string((string *)&local_68);
        Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
        ~basic_formatter(&local_1e0);
        this = iter;
        __gnu_cxx::__normal_iterator<aiNode*const*,std::vector<aiNode*,std::allocator<aiNode*>>>::
        __normal_iterator<aiNode**>
                  ((__normal_iterator<aiNode*const*,std::vector<aiNode*,std::allocator<aiNode*>>> *)
                   &local_200,
                   (__normal_iterator<aiNode_**,_std::vector<aiNode_*,_std::allocator<aiNode_*>_>_>
                    *)&found);
        std::vector<aiNode_*,_std::allocator<aiNode_*>_>::erase
                  ((vector<aiNode_*,_std::allocator<aiNode_*>_> *)this._M_current,local_200);
        node_name_local = &local_30->mName;
      }
      return (aiNode *)node_name_local;
    }
    ppaVar2 = __gnu_cxx::
              __normal_iterator<aiNode_**,_std::vector<aiNode_*,_std::allocator<aiNode_*>_>_>::
              operator*((__normal_iterator<aiNode_**,_std::vector<aiNode_*,_std::allocator<aiNode_*>_>_>
                         *)&found);
    local_48 = *ppaVar2;
    if (local_48 == (aiNode *)0x0) {
      __assert_fail("element",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/PostProcessing/ArmaturePopulate.cpp"
                    ,0xf3,
                    "static aiNode *Assimp::ArmaturePopulate::GetNodeFromStack(const aiString &, std::vector<aiNode *> &)"
                   );
    }
    bVar1 = aiString::operator==(&local_48->mName,node_name);
    if (bVar1) {
      local_30 = local_48;
      goto LAB_005d86be;
    }
    __gnu_cxx::__normal_iterator<aiNode_**,_std::vector<aiNode_*,_std::allocator<aiNode_*>_>_>::
    operator++((__normal_iterator<aiNode_**,_std::vector<aiNode_*,_std::allocator<aiNode_*>_>_> *)
               &found);
  } while( true );
}

Assistant:

aiNode *ArmaturePopulate::GetNodeFromStack(const aiString &node_name,
                                           std::vector<aiNode *> &nodes) {
  std::vector<aiNode *>::iterator iter;
  aiNode *found = nullptr;
  for (iter = nodes.begin(); iter < nodes.end(); ++iter) {
    aiNode *element = *iter;
    ai_assert(element);
    // node valid and node name matches
    if (element->mName == node_name) {
      found = element;
      break;
    }
  }

  if (found != nullptr) {
    ASSIMP_LOG_INFO_F("Removed node from stack: ", found->mName.C_Str());
    // now pop the element from the node list
    nodes.erase(iter);

    return found;
  }

  // unique names can cause this problem
  ASSIMP_LOG_ERROR("[Serious] GetNodeFromStack() can't find node from stack!");

  return nullptr;
}